

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImU32 col;
  int iVar4;
  int idx;
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool held;
  bool hovered;
  ImVec2 size_local;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  ImRect bb;
  
  pIVar1 = GImGui;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = size;
  size_local = (ImVec2)vmovlps_avx(auVar10._0_16_);
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    auVar8 = vmovshdup_avx(auVar10._0_16_);
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    IVar6 = (this->DC).CursorPos;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = IVar6.x;
    auVar7._4_4_ = IVar6.y;
    local_68 = size.x;
    fStack_64 = size.y;
    fStack_60 = in_register_00001208._0_4_;
    fStack_5c = in_register_00001208._4_4_;
    auVar11._0_4_ = IVar6.x + local_68;
    auVar11._4_4_ = IVar6.y + fStack_64;
    auVar11._8_4_ = fStack_60 + 0.0;
    auVar11._12_4_ = fStack_5c + 0.0;
    bb = (ImRect)vmovlhps_avx(auVar7,auVar11);
    fVar5 = GetFrameHeight();
    local_58 = auVar8._0_4_;
    if (fVar5 <= local_58) {
      fVar5 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar5 = -1.0;
    }
    ItemSize(&size_local,fVar5);
    bVar3 = false;
    bVar2 = ItemAdd(&bb,id,(ImRect *)0x0);
    if (bVar2) {
      bVar3 = ButtonBehavior(&bb,id,&hovered,&held,((this->DC).ItemFlags & 2U) << 9 | flags);
      iVar4 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar4;
      }
      if (held == false) {
        idx = iVar4;
      }
      fill_col = GetColorU32(idx,1.0);
      col = GetColorU32(0,1.0);
      RenderNavHighlight(&bb,id,1);
      RenderFrame(bb.Min,bb.Max,fill_col,true,(pIVar1->Style).FrameRounding);
      auVar8._8_8_ = 0;
      auVar8._0_4_ = size_local.x;
      auVar8._4_4_ = size_local.y;
      fVar5 = pIVar1->FontSize;
      auVar12._4_4_ = fVar5;
      auVar12._0_4_ = fVar5;
      auVar12._8_4_ = fVar5;
      auVar12._12_4_ = fVar5;
      auVar8 = vsubps_avx(auVar8,auVar12);
      auVar9._0_4_ = auVar8._0_4_ * 0.5;
      auVar9._4_4_ = auVar8._4_4_ * 0.5;
      auVar9._8_4_ = auVar8._8_4_ * 0.5;
      auVar9._12_4_ = auVar8._12_4_ * 0.5;
      auVar8 = vcmpps_avx(auVar9,ZEXT816(0) << 0x20,6);
      auVar8 = vandps_avx(auVar8,auVar9);
      IVar6.x = bb.Min.x + auVar8._0_4_;
      IVar6.y = bb.Min.y + auVar8._4_4_;
      RenderArrow(this->DrawList,IVar6,col,dir,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}